

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcActor::IfcActor(IfcActor *this)

{
  IfcActor *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xf0,"IfcActor");
  IfcObject::IfcObject(&this->super_IfcObject,&PTR_construction_vtable_24__00fe9e18);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcActor,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcActor,_1UL> *)
             &(this->super_IfcObject).field_0xd0,&PTR_construction_vtable_24__00fe9e90);
  *(undefined8 *)&this->super_IfcObject = 0xfe9d60;
  *(undefined8 *)&this->field_0xf0 = 0xfe9e00;
  *(undefined8 *)&(this->super_IfcObject).field_0x88 = 0xfe9d88;
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0xfe9db0;
  *(undefined8 *)&(this->super_IfcObject).field_0xd0 = 0xfe9dd8;
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::shared_ptr
            ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)
             &(this->super_IfcObject).field_0xe0);
  return;
}

Assistant:

IfcActor() : Object("IfcActor") {}